

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::ConsoleReporter>::StreamingReporterBase
          (StreamingReporterBase<Catch::ConsoleReporter> *this,ReporterConfig *_config)

{
  ostream *poVar1;
  element_type *peVar2;
  size_type sVar3;
  ReusableStringStream *this_00;
  ReusableStringStream local_98;
  string local_80;
  key_type local_5c;
  set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> local_58;
  ReporterConfig *local_18;
  ReporterConfig *_config_local;
  StreamingReporterBase<Catch::ConsoleReporter> *this_local;
  
  local_18 = _config;
  _config_local = (ReporterConfig *)this;
  IStreamingReporter::IStreamingReporter(&this->super_IStreamingReporter);
  (this->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__StreamingReporterBase_002736d0;
  ReporterConfig::fullConfig((ReporterConfig *)&this->m_config);
  poVar1 = ReporterConfig::stream(local_18);
  this->stream = poVar1;
  LazyStat<Catch::TestRunInfo>::LazyStat(&this->currentTestRunInfo);
  LazyStat<Catch::GroupInfo>::LazyStat(&this->currentGroupInfo);
  LazyStat<Catch::TestCaseInfo>::LazyStat(&this->currentTestCaseInfo);
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::vector
            (&this->m_sectionStack);
  ReporterPreferences::ReporterPreferences(&this->m_reporterPrefs);
  (this->m_reporterPrefs).shouldRedirectStdOut = false;
  getSupportedVerbosities();
  peVar2 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_config);
  local_5c = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0x14])();
  sVar3 = clara::std::
          set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>::
          count(&local_58,&local_5c);
  clara::std::set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::~set(&local_58);
  if (sVar3 != 0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_98);
  this_00 = ReusableStringStream::operator<<
                      (&local_98,(char (*) [47])"Verbosity level not supported by this reporter");
  ReusableStringStream::str_abi_cxx11_(&local_80,this_00);
  throw_domain_error(&local_80);
}

Assistant:

StreamingReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
            if( !DerivedT::getSupportedVerbosities().count( m_config->verbosity() ) )
                CATCH_ERROR( "Verbosity level not supported by this reporter" );
        }